

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.h
# Opt level: O0

int __thiscall ev3dev::motor::duty_cycle(motor *this)

{
  int iVar1;
  string *in_stack_00000058;
  device *in_stack_00000060;
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"duty_cycle",&local_29);
  iVar1 = device::get_attr_int(in_stack_00000060,in_stack_00000058);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  return iVar1;
}

Assistant:

int duty_cycle() const { return get_attr_int("duty_cycle"); }